

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# port.cc
# Opt level: O2

shared_ptr<kratos::AssignStmt> __thiscall
kratos::Port::assign_(Port *this,shared_ptr<kratos::Var> *var,AssignmentType type)

{
  int iVar1;
  int iVar2;
  StmtException *this_00;
  UserException *this_01;
  undefined4 in_register_00000014;
  long *plVar3;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  bool bVar4;
  shared_ptr<kratos::AssignStmt> sVar5;
  basic_string_view<char> bVar6;
  string_view format_str;
  format_args args;
  initializer_list<kratos::IRNode_*> __l;
  IRNode *local_d8;
  long local_d0;
  pointer local_c8;
  element_type *peStack_c0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a8 [4];
  string local_88;
  undefined1 auStack_68 [8];
  shared_ptr<kratos::VarCasted> casted;
  allocator_type local_31;
  
  plVar3 = (long *)CONCAT44(in_register_00000014,type);
  if (*plVar3 == 0) {
    this_01 = (UserException *)__cxa_allocate_exception(0x10);
    (*(code *)(((var->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->sinks_).
              _M_h._M_buckets)(&local_88,var);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_68,
                   "Trying to assign null to ",&local_88);
    UserException::UserException(this_01,(string *)auStack_68);
    __cxa_throw(this_01,&UserException::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar1 = *(int *)(*plVar3 + 0x168);
  if (iVar1 - 3U < 2) goto LAB_00205667;
  iVar2 = *(int *)((long)&var[0x27].super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr + 4);
  bVar4 = iVar2 == 0;
  if (iVar1 != 6) {
    if (iVar2 == 0) goto LAB_00205667;
    goto LAB_002056dd;
  }
  Var::as<kratos::VarCasted>((Var *)auStack_68);
  switch(*(undefined4 *)((long)auStack_68 + 0x280)) {
  case 2:
    bVar4 = *(int *)((long)&var[0x27].super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr + 4) == 1;
    break;
  case 3:
    bVar4 = *(int *)((long)&var[0x27].super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr + 4) == 2;
    break;
  case 4:
    bVar4 = *(int *)((long)&var[0x27].super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr + 4) == 4;
    break;
  case 5:
    bVar4 = *(int *)((long)&var[0x27].super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr + 4) == 3;
    break;
  default:
    goto switchD_0020564d_default;
  }
  bVar4 = (bool)(bVar4 | iVar2 == 0);
switchD_0020564d_default:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&casted);
  if (!bVar4) {
LAB_002056dd:
    this_00 = (StmtException *)__cxa_allocate_exception(0x10);
    (**(code **)(*(long *)*plVar3 + 0xf8))(&local_c8);
    (*(code *)(((var->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->sinks_).
              _M_h._M_buckets)(local_a8,var);
    auStack_68 = (undefined1  [8])local_c8;
    casted.super___shared_ptr<kratos::VarCasted,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peStack_c0;
    casted.super___shared_ptr<kratos::VarCasted,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         local_a8[0];
    bVar6 = fmt::v7::to_string_view<char,_0>
                      ("Typing error. Cannot assign variable ({0}) to port ({1})");
    format_str.data_ = (char *)bVar6.size_;
    format_str.size_ = 0xdd;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.args_ = in_R9.args_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)auStack_68;
    fmt::v7::detail::vformat_abi_cxx11_(&local_88,(detail *)bVar6.data_,format_str,args);
    local_d0 = *plVar3;
    __l._M_len = 2;
    __l._M_array = &local_d8;
    local_d8 = (IRNode *)var;
    std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
              ((vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *)auStack_68,__l,
               &local_31);
    StmtException::StmtException
              (this_00,&local_88,
               (vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *)auStack_68);
    __cxa_throw(this_00,&StmtException::typeinfo,std::runtime_error::~runtime_error);
  }
LAB_00205667:
  sVar5 = Var::assign_(&this->super_Var,var,type);
  sVar5.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<kratos::AssignStmt>)
         sVar5.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<AssignStmt> Port::assign_(const std::shared_ptr<Var>& var,
                                          enum kratos::AssignmentType type) {
    if (!var) {
        throw UserException("Trying to assign null to " + to_string());
    }
    // notice that we have the following rules
    // var <- port. this is considered as a lower cast, hence it's allowed
    // port <- var. this is considered as an upper cast, which needs explicit casting
    if (var->type() != VarType::PortIO && var->type() != VarType::ConstValue) {
        bool allowed = port_type() == PortType::Data;
        if (var->type() == VarType::BaseCasted) {
            auto casted = var->as<VarCasted>();
            auto cast_type = casted->cast_type();
            if (cast_type == VarCastType::AsyncReset && port_type() == PortType::AsyncReset)
                allowed = true;  // NOLINT
            if (cast_type == VarCastType::Reset && port_type() == PortType::Reset)
                allowed = true;  // NOLINT
            else if (cast_type == VarCastType::Clock && port_type() == PortType::Clock)
                allowed = true;  // NOLINT
            else if (cast_type == VarCastType::ClockEnable && port_type() == PortType::ClockEnable)
                allowed = true;  // NOLINT
        }
        if (!allowed) {
            throw StmtException(::format("Typing error. Cannot assign variable ({0}) to port ({1})",
                                         var->to_string(), to_string()),
                                {this, var.get()});
        }
    }
    return Var::assign_(var, type);
}